

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall demo::CaptureLogging::AppendLine(CaptureLogging *this,string *line)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x115485);
  Logging::DefaultAppendLine((string *)0x11548f);
  return;
}

Assistant:

void CaptureLogging::AppendLine(const std::string& line) {
  {
    std::lock_guard<std::mutex> lock(data_lock_);
    lines_.emplace_back(line);
  }
  DefaultAppendLine(line);
}